

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O0

QString * QTlsBackendOpenSSL::getErrorsFromOpenSsl(void)

{
  bool bVar1;
  unsigned_long uVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  unsigned_long errNum;
  QString *errorString;
  char buf [256];
  char *in_stack_fffffffffffffea8;
  QString *str;
  QLatin1StringView in_stack_fffffffffffffec0;
  undefined1 local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  str = in_RDI;
  QString::QString((QString *)0x125cc8);
  memset(local_108,0,0x100);
  while (uVar2 = q_ERR_get_error(), uVar2 != 0) {
    bVar1 = QString::isEmpty((QString *)0x125d02);
    if (!bVar1) {
      in_stack_fffffffffffffec0 =
           Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
      QString::append((QLatin1String *)in_RDI);
    }
    q_ERR_error_string_n((unsigned_long)in_RDI,in_stack_fffffffffffffea8,0x125d49);
    QLatin1String::QLatin1String((QLatin1String *)in_stack_fffffffffffffec0.m_size,(char *)str);
    QString::append((QLatin1String *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return str;
}

Assistant:

QString QTlsBackendOpenSSL::getErrorsFromOpenSsl()
{
    QString errorString;
    char buf[256] = {}; // OpenSSL docs claim both 120 and 256; use the larger.
    unsigned long errNum;
    while ((errNum = q_ERR_get_error())) {
        if (!errorString.isEmpty())
            errorString.append(", "_L1);
        q_ERR_error_string_n(errNum, buf, sizeof buf);
        errorString.append(QLatin1StringView(buf)); // error is ascii according to man ERR_error_string
    }
    return errorString;
}